

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_AngleValue *
ON_AngleValue::CreateFromString
          (ON_AngleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string)

{
  ON_AngleValue *__return_storage_ptr___00;
  ON_AngleValue angle_value;
  wchar_t *string_end;
  
  if ((string == (wchar_t *)0x0) || (*string == L'\0')) {
    ON_AngleValue(__return_storage_ptr__,&Unset);
  }
  else {
    string_end = (wchar_t *)0x0;
    __return_storage_ptr___00 = &angle_value;
    CreateFromSubString(__return_storage_ptr___00,parse_settings,string,-1,&string_end);
    if (string_end <= string) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x376,"","Invalid input parameters.");
      __return_storage_ptr___00 = &Unset;
    }
    ON_AngleValue(__return_storage_ptr__,__return_storage_ptr___00);
    ON_wString::~ON_wString(&angle_value.m_angle_as_string);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::CreateFromString(
  ON_ParseSettings parse_settings,
  const wchar_t* string
)
{
  if ( nullptr == string || 0 == string[0] )
    return ON_AngleValue::Unset;

  const wchar_t* string_end = nullptr;
  const ON_AngleValue angle_value = ON_AngleValue::CreateFromSubString(parse_settings, string, -1, &string_end);
  if (nullptr == string_end || !(string < string_end))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_AngleValue::Unset;
  }

  return angle_value;
}